

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * actionName(u8 action)

{
  char *local_18;
  char *zName;
  u8 action_local;
  
  switch(action) {
  case '\a':
    local_18 = "RESTRICT";
    break;
  case '\b':
    local_18 = "SET NULL";
    break;
  case '\t':
    local_18 = "SET DEFAULT";
    break;
  case '\n':
    local_18 = "CASCADE";
    break;
  default:
    local_18 = "NO ACTION";
  }
  return local_18;
}

Assistant:

static const char *actionName(u8 action){
  const char *zName;
  switch( action ){
    case OE_SetNull:  zName = "SET NULL";        break;
    case OE_SetDflt:  zName = "SET DEFAULT";     break;
    case OE_Cascade:  zName = "CASCADE";         break;
    case OE_Restrict: zName = "RESTRICT";        break;
    default:          zName = "NO ACTION";
                      assert( action==OE_None ); break;
  }
  return zName;
}